

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

int32_t __thiscall
icu_63::BMPSet::spanBackUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  int iVar1;
  uint c;
  int32_t iVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int32_t unaff_EBX;
  byte bVar8;
  bool bVar9;
  int local_3c;
  byte local_35;
  uint local_34;
  
  local_34 = (uint)(spanCondition != USET_SPAN_NOT_CONTAINED);
  local_3c = length;
  do {
    iVar5 = local_3c + -1;
    bVar8 = s[(long)local_3c + -1];
    if (-1 < (char)bVar8) {
      lVar3 = (long)iVar5;
      iVar1 = local_3c + -2;
      local_3c = iVar5;
      if (spanCondition == USET_SPAN_NOT_CONTAINED) {
        do {
          iVar5 = iVar1;
          if (this->latin1Contains[bVar8] != '\0') goto LAB_002df862;
          if (lVar3 == 0) {
            return 0;
          }
          bVar8 = s[lVar3 + -1];
          lVar3 = lVar3 + -1;
          iVar1 = iVar5 + -1;
          local_3c = iVar5;
        } while (-1 < (char)bVar8);
      }
      else {
        do {
          iVar5 = iVar1;
          if (this->latin1Contains[bVar8] == '\0') {
LAB_002df862:
            return local_3c + 1;
          }
          if (lVar3 == 0) {
            return 0;
          }
          bVar8 = s[lVar3 + -1];
          lVar3 = lVar3 + -1;
          iVar1 = iVar5 + -1;
          local_3c = iVar5;
        } while (-1 < (char)bVar8);
      }
    }
    local_3c = iVar5;
    iVar5 = local_3c;
    c = utf8_prevCharSafeBody_63(s,0,&local_3c,(uint)bVar8,-3);
    if ((int)c < 0x800) {
      bVar8 = (byte)(this->table7FF[c & 0x3f] >> ((byte)(c >> 6) & 0x1f)) ^
              spanCondition != USET_SPAN_NOT_CONTAINED;
      bVar9 = (bVar8 & 1) == 0;
      bVar4 = bVar8 ^ 1;
    }
    else {
      if ((int)c < 0x10000) {
        uVar6 = c >> 0xc;
        uVar7 = *(uint *)((long)this->bmpBlockBits + (ulong)(c >> 4 & 0xfc)) >> ((byte)uVar6 & 0x1f)
                & 0x10001;
        if (uVar7 < 2) {
          bVar9 = uVar7 == local_34;
          bVar4 = bVar9;
          goto LAB_002df84a;
        }
        local_35 = spanCondition != USET_SPAN_NOT_CONTAINED;
        iVar2 = findCodePoint(this,c,this->list4kStarts[uVar6],this->list4kStarts[(ulong)uVar6 + 1])
        ;
        bVar8 = (byte)iVar2 ^ local_35;
      }
      else {
        iVar2 = findCodePoint(this,c,this->list4kStarts[0x10],this->list4kStarts[0x11]);
        bVar8 = (byte)iVar2 ^ spanCondition != USET_SPAN_NOT_CONTAINED;
      }
      bVar4 = bVar8 ^ 1;
      bVar9 = (bVar8 & 1) == 0;
    }
LAB_002df84a:
    if (!bVar9) {
      unaff_EBX = iVar5 + 1;
    }
    if ((bVar4 & 1) == 0) {
      return unaff_EBX;
    }
    if (local_3c < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t
BMPSet::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    uint8_t b;

    do {
        b=s[--length];
        if(U8_IS_SINGLE(b)) {
            // ASCII sub-span
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            }
        }

        int32_t prev=length;
        UChar32 c;
        // trail byte: collect a multi-byte character
        // (or  lead byte in last-trail position)
        c=utf8_prevCharSafeBody(s, 0, &length, b, -3);
        // c is a valid code point, not ASCII, not a surrogate
        if(c<=0x7ff) {
            if((USetSpanCondition)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) != spanCondition) {
                return prev+1;
            }
        } else if(c<=0xffff) {
            int lead=c>>12;
            uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
            if(twoBits<=1) {
                // All 64 code points with the same bits 15..6
                // are either in the set or not.
                if(twoBits!=(uint32_t)spanCondition) {
                    return prev+1;
                }
            } else {
                // Look up the code point in its 4k block of code points.
                if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]) != spanCondition) {
                    return prev+1;
                }
            }
        } else {
            if(containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) != spanCondition) {
                return prev+1;
            }
        }
    } while(length>0);
    return 0;
}